

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O0

size_t pstore::command_line::details::widest_option(categories_collection *categories)

{
  bool bVar1;
  reference ppVar2;
  reference ppVar3;
  value_type *__t;
  unsigned_long *puVar4;
  options_set *ops;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *name;
  const_iterator __end4;
  const_iterator __begin4;
  small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
  *__range4;
  pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>
  *sw;
  iterator __end3;
  iterator __begin3;
  switch_strings *__range3;
  pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>
  *cat;
  const_iterator __end2;
  const_iterator __begin2;
  categories_collection *__range2;
  size_t max_name_len;
  categories_collection *categories_local;
  
  __range2 = (categories_collection *)0x0;
  max_name_len = (size_t)categories;
  __end2 = std::
           map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
           ::begin(categories);
  cat = (pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>
         *)std::
           map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
           ::end(categories);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&cat);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
             ::operator*(&__end2);
    get_switch_strings_abi_cxx11_((switch_strings *)&__begin3,(details *)&ppVar2->second,ops);
    __end3 = std::
             map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
             ::begin((map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
                      *)&__begin3);
    sw = (pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>
          *)std::
            map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
            ::end((map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
                   *)&__begin3);
    while( true ) {
      bVar1 = std::operator!=(&__end3,(_Self *)&sw);
      if (!bVar1) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>
               ::operator*(&__end3);
      __end4 = small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
               ::begin(&ppVar3->second);
      name = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
              *)small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
                ::end(&ppVar3->second);
      while( true ) {
        bVar1 = pointer_based_iterator<std::tuple<std::__cxx11::string,unsigned_long>const>::
                operator!=((pointer_based_iterator<std::tuple<std::__cxx11::string,unsigned_long>const>
                            *)&__end4,
                           (pointer_based_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                            *)&name);
        if (!bVar1) break;
        __t = pointer_based_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
              ::operator*(&__end4);
        puVar4 = std::get<unsigned_long,std::__cxx11::string,unsigned_long>(__t);
        puVar4 = std::max<unsigned_long>((unsigned_long *)&__range2,puVar4);
        __range2 = (categories_collection *)*puVar4;
        pointer_based_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
        ::operator++(&__end4);
      }
      std::
      _Rb_tree_iterator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>
      ::operator++(&__end3);
    }
    std::
    map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
    ::~map((map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
            *)&__begin3);
    std::
    _Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
    ::operator++(&__end2);
  }
  puVar4 = std::min<unsigned_long>((unsigned_long *)&__range2,&overlong_opt_max);
  return *puVar4;
}

Assistant:

std::size_t widest_option (categories_collection const & categories) {
                    auto max_name_len = std::size_t{0};
                    for (auto const & cat : categories) {
                        for (auto const & sw : get_switch_strings (cat.second)) {
                            for (std::tuple<std::string, std::size_t> const & name : sw.second) {
                                max_name_len =
                                    std::max (max_name_len, std::get<std::size_t> (name));
                            }
                        }
                    }
                    return std::min (max_name_len, overlong_opt_max);
                }